

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O0

void __thiscall
StunMsgCxx_RFC5769SampleRequest_Test::TestBody(StunMsgCxx_RFC5769SampleRequest_Test *this)

{
  bool bVar1;
  base_message<std::allocator<unsigned_char>_> *pbVar2;
  char *pcVar3;
  uint8_t *vec_b;
  pointer pdVar4;
  char *in_R9;
  u64 uVar5;
  iterator iVar6;
  string local_788;
  AssertHelper local_768;
  Message local_760;
  decoded local_758;
  decoded local_748;
  undefined1 local_738 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_708;
  Message local_700;
  attribute_base<_stun_attr_uint32> local_6f8;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar__8;
  Message local_6d0;
  uint16_t local_6c6;
  attribute_type local_6c4;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_690;
  Message local_688;
  decoded local_680;
  decoded local_670;
  undefined1 local_660 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_630;
  Message local_628;
  allocator<char> local_619;
  string local_618;
  attribute_base<_stun_attr_msgint> local_5f8;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar__6;
  Message local_5d0;
  uint16_t local_5c6;
  attribute_type local_5c4;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_590;
  Message local_588;
  decoded local_580;
  decoded local_570;
  undefined1 local_560 [8];
  AssertionResult gtest_ar__5;
  Message local_548;
  attribute_base<_stun_attr_varsize> local_540;
  string local_530;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_9;
  Message local_4f8;
  uint16_t local_4ee;
  attribute_type local_4ec;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_4b8;
  Message local_4b0;
  decoded local_4a8;
  decoded local_498;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__4;
  Message local_470;
  attribute_base<_stun_attr_uint64> local_468;
  uint64_t local_458;
  unsigned_long_long local_450;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_7;
  Message local_430;
  uint16_t local_426;
  attribute_type local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_3f0;
  Message local_3e8;
  decoded local_3e0;
  decoded local_3d0;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar__3;
  Message local_3a8;
  attribute_base<_stun_attr_uint32> local_3a0;
  uint32_t local_38c;
  unsigned_long local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_5;
  Message local_368;
  uint16_t local_35e;
  attribute_type local_35c;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_328;
  Message local_320;
  decoded local_318;
  decoded local_308;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__2;
  Message local_2e0;
  attribute_base<_stun_attr_varsize> local_2d8;
  string local_2c8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_3;
  Message local_290;
  uint16_t local_286;
  attribute_type local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_250;
  Message local_248;
  decoded local_240;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__1;
  iterator i;
  Message local_208;
  uint16_t local_1fe;
  type local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_1a0;
  Message local_198;
  size_t local_190;
  unsigned_long local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  msgint local_168;
  varsize<char> local_158;
  u64 local_138;
  u32 local_124 [2];
  varsize<char> local_110;
  undefined1 local_f0 [8];
  message message;
  uint8_t tsx_id [12];
  uint8_t expected_result [108];
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char password [23];
  char local_38 [8];
  char username [10];
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char software_name [17];
  StunMsgCxx_RFC5769SampleRequest_Test *this_local;
  
  username[8] = 'S';
  username[9] = 'T';
  cStack_26 = 'U';
  cStack_25 = 'N';
  cStack_24 = ' ';
  cStack_23 = 't';
  cStack_22 = 'e';
  cStack_21 = 's';
  builtin_strncpy(local_38,"evtj:h6v",8);
  username[0] = 'Y';
  username[1] = '\0';
  builtin_memcpy(expected_result + 0x68,"VOkJ",4);
  cStack_54 = 'x';
  cStack_53 = 'b';
  cStack_52 = 'R';
  cStack_51 = 'l';
  expected_result[0x58] = 0xc1;
  expected_result[0x59] = 0xb5;
  expected_result[0x5a] = 'q';
  expected_result[0x5b] = 0xa2;
  expected_result[0x5c] = 0x80;
  expected_result[0x5d] = '(';
  expected_result[0x5e] = '\0';
  expected_result[0x5f] = '\x04';
  expected_result[0x60] = 0xe5;
  expected_result[0x61] = 'z';
  expected_result[0x62] = ';';
  expected_result[99] = 0xcf;
  expected_result[0x48] = 0x9a;
  expected_result[0x49] = 0xea;
  expected_result[0x4a] = 0xa7;
  expected_result[0x4b] = '\f';
  expected_result[0x4c] = 0xbf;
  expected_result[0x4d] = 0xd8;
  expected_result[0x4e] = 0xcb;
  expected_result[0x4f] = 'V';
  expected_result[0x50] = 'x';
  expected_result[0x51] = '\x1e';
  expected_result[0x52] = 0xf2;
  expected_result[0x53] = 0xb5;
  expected_result[0x54] = 0xb2;
  expected_result[0x55] = 0xd3;
  expected_result[0x56] = 0xf2;
  expected_result[0x57] = 'I';
  builtin_memcpy(expected_result + 0x38,"evtj:h6vY   ",0xd);
  expected_result[0x45] = '\b';
  expected_result[0x46] = '\0';
  expected_result[0x47] = '\x14';
  expected_result[0x28] = 0x80;
  expected_result[0x29] = ')';
  expected_result[0x2a] = '\0';
  expected_result[0x2b] = '\b';
  expected_result[0x2c] = 0x93;
  expected_result[0x2d] = '/';
  expected_result[0x2e] = 0xf9;
  expected_result[0x2f] = 0xb1;
  expected_result[0x30] = 'Q';
  expected_result[0x31] = '&';
  expected_result[0x32] = ';';
  expected_result[0x33] = '6';
  expected_result[0x34] = '\0';
  expected_result[0x35] = '\x06';
  expected_result[0x36] = '\0';
  expected_result[0x37] = '\t';
  builtin_memcpy(expected_result + 0x18,"t client",9);
  expected_result[0x21] = '$';
  expected_result[0x22] = '\0';
  expected_result[0x23] = '\x04';
  expected_result[0x24] = 'n';
  expected_result[0x25] = '\0';
  expected_result[0x26] = '\x01';
  expected_result[0x27] = 0xff;
  expected_result[8] = 0xfa;
  expected_result[9] = 0x87;
  expected_result[10] = 0xdf;
  expected_result[0xb] = 0xae;
  expected_result[0xc] = 0x80;
  expected_result[0xd] = '\"';
  expected_result[0xe] = '\0';
  expected_result[0xf] = '\x10';
  expected_result[0x10] = 'S';
  expected_result[0x11] = 'T';
  expected_result[0x12] = 'U';
  expected_result[0x13] = 'N';
  expected_result[0x14] = ' ';
  expected_result[0x15] = 't';
  expected_result[0x16] = 'e';
  expected_result[0x17] = 's';
  stack0xffffffffffffff38 = 0x42a4122158000100;
  expected_result[0] = 0xb7;
  expected_result[1] = 0xe7;
  expected_result[2] = 0xa7;
  expected_result[3] = '\x01';
  expected_result[4] = 0xbc;
  expected_result[5] = '4';
  expected_result[6] = 0xd6;
  expected_result[7] = 0x86;
  message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x86d634bc01a7e7b7;
  tsx_id[0] = 0xfa;
  tsx_id[1] = 0x87;
  tsx_id[2] = 0xdf;
  tsx_id[3] = 0xae;
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            ((base_message<std::allocator<unsigned_char>_> *)local_f0,1,
             (uint8_t *)
             &message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  stun::attribute::software(&local_110,username + 8,' ');
  pbVar2 = stun::operator<<((base_message<std::allocator<unsigned_char>_> *)local_f0,&local_110);
  local_124[0] = stun::attribute::priority(0x6e0001ff);
  pbVar2 = stun::operator<<(pbVar2,local_124);
  uVar5 = stun::attribute::ice_controlled(0x932ff9b151263b36);
  local_138.value_ = uVar5.value_;
  local_138.type_ = uVar5.type_;
  pbVar2 = stun::operator<<(pbVar2,&local_138);
  stun::attribute::username(&local_158,local_38,' ');
  pbVar2 = stun::operator<<(pbVar2,&local_158);
  local_168 = stun::attribute::message_integrity((char *)(expected_result + 0x68));
  pbVar2 = stun::operator<<(pbVar2,&local_168);
  stun::attribute::fingerprint();
  stun::operator<<(pbVar2,(fingerprint *)((long)&gtest_ar.message_.ptr_ + 7));
  local_188 = 0x6c;
  local_190 = stun::base_message<std::allocator<unsigned_char>_>::size
                        ((base_message<std::allocator<unsigned_char>_> *)local_f0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_180,"sizeof(expected_result)","message.size()",&local_188,
             &local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  gtest_ar_.message_.ptr_._5_3_ = 0;
  gtest_ar_.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
    vec_b = stun::base_message<std::allocator<unsigned_char>_>::data
                      ((base_message<std::allocator<unsigned_char>_> *)local_f0);
    anon_unknown.dwarf_f3ff::IsEqual((anon_unknown_dwarf_f3ff *)local_1b8,tsx_id + 8,vec_b,0x6c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_1b8,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x98,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
    local_1fc = binding_request;
    local_1fe = stun::base_message<std::allocator<unsigned_char>_>::type
                          ((base_message<std::allocator<unsigned_char>_> *)local_f0);
    testing::internal::EqHelper<false>::
    Compare<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((EqHelper<false> *)local_1f8,"stun::message::binding_request","message.type()",
               &local_1fc,&local_1fe);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
    if (!bVar1) {
      testing::Message::Message(&local_208);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i.attr_.attr_hdr_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x9c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i.attr_.attr_hdr_,&local_208);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i.attr_.attr_hdr_);
      testing::Message::~Message(&local_208);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
    iVar6 = stun::base_message<std::allocator<unsigned_char>_>::begin
                      ((base_message<std::allocator<unsigned_char>_> *)local_f0);
    i.attr_.msg_hdr_ = (stun_msg_hdr *)iVar6.attr_.attr_hdr_;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar6.attr_.msg_hdr_;
    local_240 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                   ((base_message<std::allocator<unsigned_char>_> *)local_f0);
    bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                      ((iterator *)&local_240,(self_type *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_230,bVar1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      testing::Message::Message(&local_248);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_230,
                 (AssertionResult *)"message.end() != i","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x9f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_250,&local_248);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_248);
    }
    gtest_ar_.message_.ptr_._5_3_ = 0;
    gtest_ar_.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
    if (gtest_ar_.message_.ptr_._4_4_ == 0) {
      local_284 = software;
      pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                         ((iterator *)&gtest_ar__1.message_);
      local_286 = stun::attribute::decoded::type(pdVar4);
      testing::internal::EqHelper<false>::
      Compare<stun::attribute::type::attribute_type,unsigned_short>
                ((EqHelper<false> *)local_280,"type::software","i->type()",&local_284,&local_286);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
      if (!bVar1) {
        testing::Message::Message(&local_290);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0xa0,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_290);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_290);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
      pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                         ((iterator *)&gtest_ar__1.message_);
      local_2d8 = (attribute_base<_stun_attr_varsize>)
                  stun::attribute::decoded::to<(stun::attribute::type::attribute_type)32802>(pdVar4)
      ;
      stun::attribute::decoding_bits::string::to_string_abi_cxx11_(&local_2c8,(string *)&local_2d8);
      testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
                ((EqHelper<false> *)local_2a8,"software_name","i->to<type::software>().to_string()",
                 (char (*) [17])(username + 8),&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
      if (!bVar1) {
        testing::Message::Message(&local_2e0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0xa2,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_2e0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_2e0);
      }
      gtest_ar_.message_.ptr_._5_3_ = 0;
      gtest_ar_.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
      if (gtest_ar_.message_.ptr_._4_4_ == 0) {
        local_308 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                       ((base_message<std::allocator<unsigned_char>_> *)local_f0);
        local_318 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                             operator++((iterator *)&gtest_ar__1.message_);
        bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                          ((iterator *)&local_308,(self_type *)&local_318);
        testing::AssertionResult::AssertionResult((AssertionResult *)local_2f8,bVar1);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
        if (!bVar1) {
          testing::Message::Message(&local_320);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_4.message_,(internal *)local_2f8,
                     (AssertionResult *)"message.end() != ++i","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_328,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0xa4,pcVar3);
          testing::internal::AssertHelper::operator=(&local_328,&local_320);
          testing::internal::AssertHelper::~AssertHelper(&local_328);
          std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_320);
        }
        gtest_ar_.message_.ptr_._5_3_ = 0;
        gtest_ar_.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
        if (gtest_ar_.message_.ptr_._4_4_ == 0) {
          local_35c = priority;
          pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                             ((iterator *)&gtest_ar__1.message_);
          local_35e = stun::attribute::decoded::type(pdVar4);
          testing::internal::EqHelper<false>::
          Compare<stun::attribute::type::attribute_type,unsigned_short>
                    ((EqHelper<false> *)local_358,"type::priority","i->type()",&local_35c,&local_35e
                    );
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
          if (!bVar1) {
            testing::Message::Message(&local_368);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0xa5,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_368);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_368);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
          local_388 = 0x6e0001ff;
          pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                             ((iterator *)&gtest_ar__1.message_);
          local_3a0 = (attribute_base<_stun_attr_uint32>)
                      stun::attribute::decoded::to<(stun::attribute::type::attribute_type)36>
                                (pdVar4);
          local_38c = stun::attribute::decoding_bits::u32::value((u32 *)&local_3a0);
          testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                    ((EqHelper<false> *)local_380,"0x6e0001fful","i->to<type::priority>().value()",
                     &local_388,&local_38c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
          if (!bVar1) {
            testing::Message::Message(&local_3a8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0xa7,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__3.message_,&local_3a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
            testing::Message::~Message(&local_3a8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
          local_3d0 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                         ((base_message<std::allocator<unsigned_char>_> *)local_f0);
          local_3e0 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                               operator++((iterator *)&gtest_ar__1.message_);
          bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                            ((iterator *)&local_3d0,(self_type *)&local_3e0);
          testing::AssertionResult::AssertionResult((AssertionResult *)local_3c0,bVar1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
          if (!bVar1) {
            testing::Message::Message(&local_3e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_6.message_,(internal *)local_3c0,
                       (AssertionResult *)"message.end() != ++i","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0xa9,pcVar3);
            testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
            testing::internal::AssertHelper::~AssertHelper(&local_3f0);
            std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_3e8);
          }
          gtest_ar_.message_.ptr_._5_3_ = 0;
          gtest_ar_.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
          if (gtest_ar_.message_.ptr_._4_4_ == 0) {
            local_424 = ice_controlled;
            pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                               ((iterator *)&gtest_ar__1.message_);
            local_426 = stun::attribute::decoded::type(pdVar4);
            testing::internal::EqHelper<false>::
            Compare<stun::attribute::type::attribute_type,unsigned_short>
                      ((EqHelper<false> *)local_420,"type::ice_controlled","i->type()",&local_424,
                       &local_426);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
            if (!bVar1) {
              testing::Message::Message(&local_430);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0xaa,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_7.message_,&local_430);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
              testing::Message::~Message(&local_430);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
            local_450 = 0x932ff9b151263b36;
            pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                               ((iterator *)&gtest_ar__1.message_);
            local_468 = (attribute_base<_stun_attr_uint64>)
                        stun::attribute::decoded::to<(stun::attribute::type::attribute_type)32809>
                                  (pdVar4);
            local_458 = stun::attribute::decoding_bits::u64::value((u64 *)&local_468);
            testing::internal::EqHelper<false>::Compare<unsigned_long_long,unsigned_long>
                      ((EqHelper<false> *)local_448,"0x932ff9b151263b36ull",
                       "i->to<type::ice_controlled>().value()",&local_450,&local_458);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
            if (!bVar1) {
              testing::Message::Message(&local_470);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0xac,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__4.message_,&local_470);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
              testing::Message::~Message(&local_470);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
            local_498 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                           ((base_message<std::allocator<unsigned_char>_> *)local_f0
                                           );
            local_4a8 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                                 operator++((iterator *)&gtest_ar__1.message_);
            bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                              ((iterator *)&local_498,(self_type *)&local_4a8);
            testing::AssertionResult::AssertionResult((AssertionResult *)local_488,bVar1);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
            if (!bVar1) {
              testing::Message::Message(&local_4b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_8.message_,(internal *)local_488,
                         (AssertionResult *)"message.end() != ++i","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_4b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0xae,pcVar3);
              testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
              testing::internal::AssertHelper::~AssertHelper(&local_4b8);
              std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
              testing::Message::~Message(&local_4b0);
            }
            gtest_ar_.message_.ptr_._5_3_ = 0;
            gtest_ar_.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
            if (gtest_ar_.message_.ptr_._4_4_ == 0) {
              local_4ec = username;
              pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                 ((iterator *)&gtest_ar__1.message_);
              local_4ee = stun::attribute::decoded::type(pdVar4);
              testing::internal::EqHelper<false>::
              Compare<stun::attribute::type::attribute_type,unsigned_short>
                        ((EqHelper<false> *)local_4e8,"type::username","i->type()",&local_4ec,
                         &local_4ee);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
              if (!bVar1) {
                testing::Message::Message(&local_4f8);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0xaf,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_9.message_,&local_4f8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_)
                ;
                testing::Message::~Message(&local_4f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
              pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                 ((iterator *)&gtest_ar__1.message_);
              local_540 = (attribute_base<_stun_attr_varsize>)
                          stun::attribute::decoded::to<(stun::attribute::type::attribute_type)6>
                                    (pdVar4);
              stun::attribute::decoding_bits::string::to_string_abi_cxx11_
                        (&local_530,(string *)&local_540);
              testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
                        ((EqHelper<false> *)local_510,"username",
                         "i->to<type::username>().to_string()",(char (*) [10])local_38,&local_530);
              std::__cxx11::string::~string((string *)&local_530);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
              if (!bVar1) {
                testing::Message::Message(&local_548);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0xb1,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__5.message_,&local_548);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__5.message_);
                testing::Message::~Message(&local_548);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
              local_570 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                             ((base_message<std::allocator<unsigned_char>_> *)
                                              local_f0);
              local_580 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                                   operator++((iterator *)&gtest_ar__1.message_);
              bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                                ((iterator *)&local_570,(self_type *)&local_580);
              testing::AssertionResult::AssertionResult((AssertionResult *)local_560,bVar1);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
              if (!bVar1) {
                testing::Message::Message(&local_588);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_10.message_,(internal *)local_560,
                           (AssertionResult *)"message.end() != ++i","false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_590,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0xb3,pcVar3);
                testing::internal::AssertHelper::operator=(&local_590,&local_588);
                testing::internal::AssertHelper::~AssertHelper(&local_590);
                std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
                testing::Message::~Message(&local_588);
              }
              gtest_ar_.message_.ptr_._5_3_ = 0;
              gtest_ar_.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
              if (gtest_ar_.message_.ptr_._4_4_ == 0) {
                local_5c4 = message_integrity;
                pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                   ((iterator *)&gtest_ar__1.message_);
                local_5c6 = stun::attribute::decoded::type(pdVar4);
                testing::internal::EqHelper<false>::
                Compare<stun::attribute::type::attribute_type,unsigned_short>
                          ((EqHelper<false> *)local_5c0,"type::message_integrity","i->type()",
                           &local_5c4,&local_5c6);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_5c0);
                if (!bVar1) {
                  testing::Message::Message(&local_5d0);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                             ,0xb4,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__6.message_,&local_5d0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__6.message_);
                  testing::Message::~Message(&local_5d0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
                pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                   ((iterator *)&gtest_ar__1.message_);
                local_5f8 = (attribute_base<_stun_attr_msgint>)
                            stun::attribute::decoded::to<(stun::attribute::type::attribute_type)8>
                                      (pdVar4);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_618,(char *)(expected_result + 0x68),&local_619);
                bVar1 = stun::attribute::decoding_bits::msgint::check_integrity
                                  ((msgint *)&local_5f8,&local_618);
                testing::AssertionResult::AssertionResult((AssertionResult *)local_5e8,bVar1);
                std::__cxx11::string::~string((string *)&local_618);
                std::allocator<char>::~allocator(&local_619);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_5e8);
                if (!bVar1) {
                  testing::Message::Message(&local_628);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__7.message_,(internal *)local_5e8,
                             (AssertionResult *)
                             "i->to<type::message_integrity>().check_integrity(password)","false",
                             "true",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_630,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                             ,0xb6,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_630,&local_628);
                  testing::internal::AssertHelper::~AssertHelper(&local_630);
                  std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                  testing::Message::~Message(&local_628);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
                local_670 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                               ((base_message<std::allocator<unsigned_char>_> *)
                                                local_f0);
                local_680 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                                     operator++((iterator *)&gtest_ar__1.message_);
                bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                                  ((iterator *)&local_670,(self_type *)&local_680);
                testing::AssertionResult::AssertionResult((AssertionResult *)local_660,bVar1);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_660);
                if (!bVar1) {
                  testing::Message::Message(&local_688);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_11.message_,(internal *)local_660,
                             (AssertionResult *)"message.end() != ++i","false","true",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_690,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                             ,0xb8,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_690,&local_688);
                  testing::internal::AssertHelper::~AssertHelper(&local_690);
                  std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
                  testing::Message::~Message(&local_688);
                }
                gtest_ar_.message_.ptr_._5_3_ = 0;
                gtest_ar_.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
                if (gtest_ar_.message_.ptr_._4_4_ == 0) {
                  local_6c4 = fingerprint;
                  pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                     ((iterator *)&gtest_ar__1.message_);
                  local_6c6 = stun::attribute::decoded::type(pdVar4);
                  testing::internal::EqHelper<false>::
                  Compare<stun::attribute::type::attribute_type,unsigned_short>
                            ((EqHelper<false> *)local_6c0,"type::fingerprint","i->type()",&local_6c4
                             ,&local_6c6);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_6c0);
                  if (!bVar1) {
                    testing::Message::Message(&local_6d0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                               ,0xb9,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__8.message_,&local_6d0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_6d0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
                  pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                     ((iterator *)&gtest_ar__1.message_);
                  local_6f8 = (attribute_base<_stun_attr_uint32>)
                              stun::attribute::decoded::
                              to<(stun::attribute::type::attribute_type)32808>(pdVar4);
                  bVar1 = stun::attribute::decoding_bits::fingerprint::check_integrity
                                    ((fingerprint *)&local_6f8);
                  testing::AssertionResult::AssertionResult((AssertionResult *)local_6e8,bVar1);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_6e8);
                  if (!bVar1) {
                    testing::Message::Message(&local_700);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__9.message_,(internal *)local_6e8,
                               (AssertionResult *)"i->to<type::fingerprint>().check_integrity()",
                               "false","true",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_708,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                               ,0xbb,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_708,&local_700);
                    testing::internal::AssertHelper::~AssertHelper(&local_708);
                    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                    testing::Message::~Message(&local_700);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
                  local_748 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                                 ((base_message<std::allocator<unsigned_char>_> *)
                                                  local_f0);
                  local_758 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator
                                       ::operator++((iterator *)&gtest_ar__1.message_);
                  bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator==
                                    ((iterator *)&local_748,(self_type *)&local_758);
                  testing::AssertionResult::AssertionResult((AssertionResult *)local_738,bVar1);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_738);
                  if (!bVar1) {
                    testing::Message::Message(&local_760);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_788,(internal *)local_738,
                               (AssertionResult *)"message.end() == ++i","false","true",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_768,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                               ,0xbd,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_768,&local_760);
                    testing::internal::AssertHelper::~AssertHelper(&local_768);
                    std::__cxx11::string::~string((string *)&local_788);
                    testing::Message::~Message(&local_760);
                  }
                  gtest_ar_.message_.ptr_._5_3_ = 0;
                  gtest_ar_.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
                  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
                    gtest_ar_.message_.ptr_._4_4_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  stun::base_message<std::allocator<unsigned_char>_>::~base_message
            ((base_message<std::allocator<unsigned_char>_> *)local_f0);
  return;
}

Assistant:

TEST(StunMsgCxx, RFC5769SampleRequest) {
  const char software_name[] = "STUN test client";
  const char username[] = "evtj:h6vY";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x58, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x10, //    SOFTWARE attribute header
    0x53,0x54,0x55,0x4e, // }
    0x20,0x74,0x65,0x73, // }  User-agent...
    0x74,0x20,0x63,0x6c, // }  ...name
    0x69,0x65,0x6e,0x74, // }
    0x00,0x24,0x00,0x04, //    PRIORITY attribute header
    0x6e,0x00,0x01,0xff, //    ICE priority value
    0x80,0x29,0x00,0x08, //    ICE-CONTROLLED attribute header
    0x93,0x2f,0xf9,0xb1, // }  Pseudo-random tie breaker...
    0x51,0x26,0x3b,0x36, // }   ...for ICE control
    0x00,0x06,0x00,0x09, //    USERNAME attribute header
    0x65,0x76,0x74,0x6a, // }
    0x3a,0x68,0x36,0x76, // }  Username (9 bytes) and padding (3 bytes)
    0x59,0x20,0x20,0x20, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x9a,0xea,0xa7,0x0c, // }
    0xbf,0xd8,0xcb,0x56, // }
    0x78,0x1e,0xf2,0xb5, // }  HMAC-SHA1 fingerprint
    0xb2,0xd3,0xf2,0x49, // }
    0xc1,0xb5,0x71,0xa2, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xe5,0x7a,0x3b,0xcf, //    CRC0x32, fingerprint
  };

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  stun::message message(stun::message::binding_request, tsx_id);
  message << stun::attribute::software(software_name, ' ')
          << stun::attribute::priority(0x6e0001fful)
          << stun::attribute::ice_controlled(0x932ff9b151263b36ull)
          << stun::attribute::username(username, ' ')
          << stun::attribute::message_integrity(password)
          << stun::attribute::fingerprint();
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_request, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::software, i->type());
  ASSERT_EQ(software_name,
    i->to<type::software>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::priority, i->type());
  EXPECT_EQ(0x6e0001fful,
    i->to<type::priority>().value());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::ice_controlled, i->type());
  EXPECT_EQ(0x932ff9b151263b36ull,
    i->to<type::ice_controlled>().value());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::username, i->type());
  EXPECT_EQ(username,
    i->to<type::username>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(password));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::fingerprint, i->type());
  EXPECT_TRUE(
    i->to<type::fingerprint>().check_integrity());

  ASSERT_TRUE(message.end() == ++i);
}